

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseOpeningXMLElement
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  unsigned_long *c;
  unsigned_long *c_00;
  unsigned_long *puVar1;
  unsigned_long uVar2;
  unsigned_long *c_01;
  bool bVar3;
  bool bVar4;
  byte local_c1;
  string<unsigned_long> local_b8;
  undefined1 local_a8 [24];
  string<unsigned_long> s;
  string<unsigned_long> local_78;
  undefined1 local_68 [8];
  SAttribute attr;
  unsigned_long *attributeValueEnd;
  unsigned_long *attributeValueBegin;
  unsigned_long attributeQuoteChar;
  unsigned_long *attributeNameEnd;
  unsigned_long *attributeNameBegin;
  unsigned_long *endName;
  unsigned_long *startName;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  this->CurrentNodeType = EXN_ELEMENT;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  c = this->P;
  while( true ) {
    local_c1 = 0;
    if (*this->P != 0x3e) {
      bVar3 = isWhiteSpace(this,*this->P);
      local_c1 = bVar3 ^ 0xff;
    }
    if ((local_c1 & 1) == 0) break;
    this->P = this->P + 1;
  }
  attributeNameBegin = this->P;
LAB_00b45611:
  do {
    if (*this->P == 0x3e) {
LAB_00b45966:
      if ((c < attributeNameBegin) && (attributeNameBegin[-1] == 0x2f)) {
        this->IsEmptyElement = true;
        attributeNameBegin = attributeNameBegin + -1;
      }
      core::string<unsigned_long>::string<unsigned_long>
                (&local_b8,c,(s32)((ulong)((long)attributeNameBegin - (long)c) >> 3));
      core::string<unsigned_long>::operator=(&this->NodeName,&local_b8);
      core::string<unsigned_long>::~string(&local_b8);
      this->P = this->P + 1;
      return;
    }
    bVar3 = isWhiteSpace(this,*this->P);
    if (bVar3) {
      this->P = this->P + 1;
      goto LAB_00b45611;
    }
    if (*this->P == 0x2f) {
      this->P = this->P + 1;
      this->IsEmptyElement = true;
      goto LAB_00b45966;
    }
    c_00 = this->P;
    while( true ) {
      bVar4 = isWhiteSpace(this,*this->P);
      bVar3 = false;
      if (!bVar4) {
        bVar3 = *this->P != 0x3d;
      }
      if (!bVar3) break;
      this->P = this->P + 1;
    }
    puVar1 = this->P;
    this->P = this->P + 1;
    while( true ) {
      bVar3 = false;
      if ((*this->P != 0x22) && (bVar3 = false, *this->P != 0x27)) {
        bVar3 = *this->P != 0;
      }
      if (!bVar3) break;
      this->P = this->P + 1;
    }
    if (*this->P == 0) {
      return;
    }
    uVar2 = *this->P;
    this->P = this->P + 1;
    c_01 = this->P;
    while( true ) {
      bVar3 = false;
      if (*this->P != uVar2) {
        bVar3 = *this->P != 0;
      }
      if (!bVar3) break;
      this->P = this->P + 1;
    }
    if (*this->P == 0) {
      return;
    }
    attr.Value._8_8_ = this->P;
    this->P = this->P + 1;
    SAttribute::SAttribute((SAttribute *)local_68);
    core::string<unsigned_long>::string<unsigned_long>
              (&local_78,c_00,(s32)((ulong)((long)puVar1 - (long)c_00) >> 3));
    core::string<unsigned_long>::operator=((string<unsigned_long> *)local_68,&local_78);
    core::string<unsigned_long>::~string(&local_78);
    core::string<unsigned_long>::string<unsigned_long>
              ((string<unsigned_long> *)(local_a8 + 0x10),c_01,
               (s32)((ulong)(attr.Value._8_8_ - (long)c_01) >> 3));
    replaceSpecialCharacters
              ((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)local_a8,
               (string<unsigned_long> *)this);
    core::string<unsigned_long>::operator=
              ((string<unsigned_long> *)&attr.Name.allocated,(string<unsigned_long> *)local_a8);
    core::string<unsigned_long>::~string((string<unsigned_long> *)local_a8);
    core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::push_back
              (&this->Attributes,(SAttribute *)local_68);
    core::string<unsigned_long>::~string((string<unsigned_long> *)(local_a8 + 0x10));
    SAttribute::~SAttribute((SAttribute *)local_68);
  } while( true );
}

Assistant:

void parseOpeningXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT;
		IsEmptyElement = false;
		Attributes.clear();

		// find name
		const char_type* startName = P;

		// find end of element
		while(*P != L'>' && !isWhiteSpace(*P))
			++P;

		const char_type* endName = P;

		// find Attributes
		while(*P != L'>')
		{
			if (isWhiteSpace(*P))
				++P;
			else
			{
				if (*P != L'/')
				{
					// we've got an attribute

					// read the attribute names
					const char_type* attributeNameBegin = P;

					while(!isWhiteSpace(*P) && *P != L'=')
						++P;

					const char_type* attributeNameEnd = P;
					++P;

					// read the attribute value
					// check for quotes and single quotes, thx to murphy
					while( (*P != L'\"') && (*P != L'\'') && *P) 
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type attributeQuoteChar = *P;

					++P;
					const char_type* attributeValueBegin = P;
					
					while(*P != attributeQuoteChar && *P)
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type* attributeValueEnd = P;
					++P;

					SAttribute attr;
					attr.Name = core::string<char_type>(attributeNameBegin, 
						(int)(attributeNameEnd - attributeNameBegin));

					core::string<char_type> s(attributeValueBegin, 
						(int)(attributeValueEnd - attributeValueBegin));

					attr.Value = replaceSpecialCharacters(s);
					Attributes.push_back(attr);
				}
				else
				{
					// tag is closed directly
					++P;
					IsEmptyElement = true;
					break;
				}
			}
		}

		// check if this tag is closing directly
		if (endName > startName && *(endName-1) == L'/')
		{
			// directly closing tag
			IsEmptyElement = true;
			endName--;
		}
		
		NodeName = core::string<char_type>(startName, (int)(endName - startName));

		++P;
	}